

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cmn.c
# Opt level: O1

char * isobusfs_error_to_str(isobusfs_error err)

{
  switch(err) {
  case ISOBUSFS_ERR_ACCESS_DENIED:
    return "Access Denied";
  case ISOBUSFS_ERR_INVALID_ACCESS:
    return "Invalid Access";
  case ISOBUSFS_ERR_TOO_MANY_FILES_OPEN:
    return "Too many files open";
  case ISOBUSFS_ERR_FILE_ORPATH_NOT_FOUND:
    return "File or path not found";
  case ISOBUSFS_ERR_INVALID_HANDLE:
    return "Invalid handle";
  case ISOBUSFS_ERR_INVALID_SRC_NAME:
    return "Invalid given source name";
  case ISOBUSFS_ERR_INVALID_DST_NAME:
    return "Invalid given destination name";
  case ISOBUSFS_ERR_NO_SPACE:
    return "Volume out of free space";
  case ISOBUSFS_ERR_ON_WRITE:
    return "Failure during a write operation";
  case ISOBUSFS_ERR_MEDIA_IS_NOT_PRESENT:
    return "Media is not present";
  case ISOBUSFS_ERR_ON_READ:
    return "Failure during a read operation";
  case ISOBUSFS_ERR_FUNC_NOT_SUPPORTED:
    return "Function not supported";
  case ISOBUSFS_ERR_VOLUME_NOT_INITIALIZED:
    return "Volume is possibly not initialized";
  }
  switch(err) {
  case ISOBUSFS_ERR_INVALID_REQUESTED_LENGHT:
    return "Invalid request length";
  case ISOBUSFS_ERR_OUT_OF_MEM:
    return "Out of memory";
  case ISOBUSFS_ERR_OTHER:
    return "Any other error";
  case ISOBUSFS_ERR_END_OF_FILE:
    return "End of file reached, will only be reported when file pointer is at end of file";
  default:
    return "<unknown>";
  }
}

Assistant:

const char *isobusfs_error_to_str(enum isobusfs_error err)
{
	switch (err) {
	case ISOBUSFS_ERR_ACCESS_DENIED:
		return "Access Denied";
	case ISOBUSFS_ERR_INVALID_ACCESS:
		return "Invalid Access";
	case ISOBUSFS_ERR_TOO_MANY_FILES_OPEN:
		return "Too many files open";
	case ISOBUSFS_ERR_FILE_ORPATH_NOT_FOUND:
		return "File or path not found";
	case ISOBUSFS_ERR_INVALID_HANDLE:
		return "Invalid handle";
	case ISOBUSFS_ERR_INVALID_SRC_NAME:
		return "Invalid given source name";
	case ISOBUSFS_ERR_INVALID_DST_NAME:
		return "Invalid given destination name";
	case ISOBUSFS_ERR_NO_SPACE:
		return "Volume out of free space";
	case ISOBUSFS_ERR_ON_WRITE:
		return "Failure during a write operation";
	case ISOBUSFS_ERR_MEDIA_IS_NOT_PRESENT:
		return "Media is not present";
	case ISOBUSFS_ERR_VOLUME_NOT_INITIALIZED:
		return "Volume is possibly not initialized";
	case ISOBUSFS_ERR_ON_READ:
		return "Failure during a read operation";
	case ISOBUSFS_ERR_FUNC_NOT_SUPPORTED:
		return "Function not supported";
	case ISOBUSFS_ERR_INVALID_REQUESTED_LENGHT:
		return "Invalid request length";
	case ISOBUSFS_ERR_OUT_OF_MEM:
		return "Out of memory";
	case ISOBUSFS_ERR_OTHER:
		return "Any other error";
	case ISOBUSFS_ERR_END_OF_FILE:
		return "End of file reached, will only be reported when file pointer is at end of file";
	default:
		return "<unknown>";
	}
}